

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wputils.c
# Opt level: O0

uint32_t read_next_header(read_stream infile,WavpackHeader *wphdr)

{
  int iVar1;
  int iVar2;
  ulong *in_RSI;
  code *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  int bleft;
  uint32_t bytes_skipped;
  char *ep;
  char *sp;
  char buffer [32];
  long *data;
  long *local_48;
  uint local_2c;
  undefined1 local_28 [2];
  char cStack_26;
  char cStack_25;
  undefined1 auStack_24 [5];
  char cStack_1f;
  ulong local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  data = &local_8;
  local_2c = 0;
  local_48 = data;
  do {
    if (local_48 < data) {
      iVar1 = (int)data - (int)local_48;
      memcpy(local_28,local_48,(long)iVar1);
    }
    else {
      iVar1 = 0;
    }
    iVar2 = (*in_RDI)(local_28 + iVar1,0x20 - iVar1);
    if (iVar2 != 0x20 - iVar1) {
      local_2c = 0xffffffff;
      goto LAB_00223010;
    }
    local_48 = (long *)(local_28 + 1);
    if ((local_28[0] == 'w') && (local_28[1] == 'v')) {
      local_48 = (long *)(local_28 + 2);
      if (cStack_26 == 'p') {
        local_48 = (long *)(local_28 + 3);
        if ((((cStack_25 == 'k') &&
             (local_48 = (long *)(local_28 + 4), (_local_28 & 0x100000000) == 0)) &&
            (auStack_24[2] < '\x10')) &&
           (((auStack_24[3] == '\0' && (cStack_1f == '\x04')) &&
            (('\x01' < auStack_24[4] && (auStack_24[4] < '\x11')))))) {
          *in_RSI = _local_28;
          in_RSI[1] = stack0xffffffffffffffe0;
          in_RSI[2] = local_18;
          in_RSI[3] = local_10;
          little_endian_to_native(data,(char *)CONCAT44(local_2c,iVar1));
          goto LAB_00223010;
        }
      }
    }
    while( true ) {
      bVar3 = false;
      if (local_48 < data) {
        bVar3 = (char)*local_48 != 'w';
      }
      if (!bVar3) break;
      local_48 = (long *)((long)local_48 + 1);
    }
    local_2c = local_2c + ((int)local_48 - (int)local_28);
  } while (local_2c < 0x100001);
  local_2c = 0xffffffff;
LAB_00223010:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

static uint32_t read_next_header (read_stream infile, WavpackHeader *wphdr)
{
    char buffer [sizeof (*wphdr)], *sp = buffer + sizeof (*wphdr), *ep = sp;
    uint32_t bytes_skipped = 0;
    int bleft;

    while (1) {
        if (sp < ep) {
            bleft = ep - sp;
            memcpy (buffer, sp, bleft);
        }
        else
            bleft = 0;

        if (infile (buffer + bleft, sizeof (*wphdr) - bleft) != (int32_t) sizeof (*wphdr) - bleft)
            return -1;

        sp = buffer;

        if (*sp++ == 'w' && *sp == 'v' && *++sp == 'p' && *++sp == 'k' &&
            !(*++sp & 1) && sp [2] < 16 && !sp [3] && sp [5] == 4 &&
            sp [4] >= (MIN_STREAM_VERS & 0xff) && sp [4] <= (MAX_STREAM_VERS & 0xff)) {
                memcpy (wphdr, buffer, sizeof (*wphdr));
                little_endian_to_native (wphdr, WavpackHeaderFormat);
                return bytes_skipped;
            }

        while (sp < ep && *sp != 'w')
            sp++;

        if ((bytes_skipped += sp - buffer) > 1048576L)
            return -1;
    }
}